

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O0

void Am_Inplace_Move_Cursor_Left(Am_Object *text)

{
  byte bVar1;
  Am_Value *pAVar2;
  void *value_00;
  Am_Value *pAVar3;
  ushort uVar4;
  Am_Object local_50;
  byte local_41;
  bool success;
  Am_String value;
  Am_Text_Navigate *text_nav;
  Am_Object local_20;
  int local_14;
  Am_Object *pAStack_10;
  int index;
  Am_Object *text_local;
  
  uVar4 = (ushort)text;
  pAStack_10 = text;
  pAVar2 = (Am_Value *)Am_Object::Get(uVar4,0xad);
  local_14 = Am_Value::operator_cast_to_int(pAVar2);
  if (local_14 < 1) {
    pAVar2 = (Am_Value *)Am_Object::Get(uVar4,(ulong)Am_INPLACE_TEXT_NAV);
    value_00 = Am_Value::operator_cast_to_void_(pAVar2);
    value.data = (Am_String_Data *)Am_Text_Navigate::Narrow(value_00);
    if (value.data != (Am_String_Data *)0x0) {
      pAVar3 = (Am_Value *)Am_Object::Get(uVar4,0xab);
      Am_String::Am_String((Am_String *)&stack0xffffffffffffffc0,pAVar3);
      bVar1 = Am_String::operator==((Am_String *)&stack0xffffffffffffffc0,"");
      if ((bVar1 & 1) == 0) {
        local_41 = (*(code *)**(undefined8 **)value.data)(value.data,2);
      }
      else {
        local_41 = (**(code **)(*(long *)value.data + 0x10))(value.data,2);
      }
      local_41 = local_41 & 1;
      Am_Object::Note_Changed(uVar4);
      if ((local_41 & 1) != 0) {
        Am_Object::Am_Object(&local_50,(Am_Object *)text);
        Am_Move_Cursor_To_End((Am_Object *)&local_50);
        Am_Object::~Am_Object(&local_50);
      }
      Am_String::~Am_String((Am_String *)&stack0xffffffffffffffc0);
    }
  }
  else {
    Am_Object::Am_Object(&local_20,(Am_Object *)text);
    Am_Move_Cursor_Left((Am_Object *)&local_20,1);
    Am_Object::~Am_Object(&local_20);
  }
  return;
}

Assistant:

static void
Am_Inplace_Move_Cursor_Left(Am_Object text)
{
  //int str_len = strlen (Am_String (text.Get (Am_TEXT)));
  int index = text.Get(Am_CURSOR_INDEX);
  if (index > 0)
    Am_Move_Cursor_Left(text, 1);
  else {
    Am_Text_Navigate *text_nav =
        Am_Text_Navigate::Narrow((Am_Ptr)text.Get(Am_INPLACE_TEXT_NAV));
    if (text_nav) {
      Am_String value = text.Get(Am_TEXT);
      bool success;
      if (value == "")
        success = text_nav->Delete(Am_INPLACE_LEFT);
      else
        success = text_nav->Move(Am_INPLACE_LEFT);
      text.Note_Changed(Am_INPLACE_TEXT_INFO);
      if (success)
        Am_Move_Cursor_To_End(text);
    }
  }
}